

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O0

void __thiscall tst_RootIndexProxyModel::insertRow(tst_RootIndexProxyModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  QAbstractItemModel *parent;
  ModelTest *this_00;
  const_reference pQVar5;
  QModelIndex local_4b8;
  QModelIndex local_4a0;
  QModelIndex local_488;
  value_type local_470;
  qint32 local_454;
  qsizetype local_450;
  QModelIndex local_448;
  QModelIndex local_430;
  QModelIndex local_418;
  value_type local_400;
  qint32 local_3e4;
  qsizetype local_3e0;
  QModelIndex local_3d8;
  QModelIndex local_3c0;
  value_type local_3a8;
  qint32 local_38c;
  qsizetype local_388;
  QModelIndex local_380;
  QModelIndex local_368;
  undefined1 local_350 [8];
  QList<QVariant> arguments;
  qsizetype local_330;
  QModelIndex local_328;
  undefined1 local_310 [24];
  QModelIndex local_2f8;
  QModelIndex local_2e0;
  QModelIndex local_2c8;
  QModelIndex local_2b0;
  undefined1 local_298 [28];
  int local_27c;
  undefined1 local_278 [4];
  int oldRowCount;
  QSignalSpy sourceRowsInsertedSpy;
  QSignalSpy sourceRowsAboutToBeInsertedSpy;
  QSignalSpy proxyRowsInsertedSpy;
  undefined1 local_f0 [8];
  QSignalSpy proxyRowsAboutToBeInsertedSpy;
  undefined1 local_58 [40];
  RootIndexProxyModel local_30 [8];
  RootIndexProxyModel proxyModel;
  QAbstractItemModel *baseModel;
  tst_RootIndexProxyModel *this_local;
  
  parent = createTreeModel(&this->super_QObject);
  RootIndexProxyModel::RootIndexProxyModel(local_30,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)local_30,(QObject *)parent);
  RootIndexProxyModel::setSourceModel((QAbstractItemModel *)local_30);
  QModelIndex::QModelIndex((QModelIndex *)&proxyRowsAboutToBeInsertedSpy.m_waiting);
  (**(code **)(*(long *)parent + 0x60))
            (local_58,parent,1,0,&proxyRowsAboutToBeInsertedSpy.m_waiting);
  RootIndexProxyModel::setRootIndex((QModelIndex *)local_30);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_f0,(QObject *)local_30,
             "2rowsAboutToBeInserted(QModelIndex, int, int)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_f0);
  bVar2 = QTest::qVerify(bVar1,"proxyRowsAboutToBeInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0xa1);
  if ((bVar2 & 1) == 0) {
    proxyRowsInsertedSpy._124_4_ = 1;
  }
  else {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)&sourceRowsAboutToBeInsertedSpy.m_waiting,(QObject *)local_30,
               "2rowsInserted(QModelIndex, int, int)");
    bVar1 = QSignalSpy::isValid((QSignalSpy *)&sourceRowsAboutToBeInsertedSpy.m_waiting);
    bVar2 = QTest::qVerify(bVar1,"proxyRowsInsertedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0xa3);
    if ((bVar2 & 1) == 0) {
      proxyRowsInsertedSpy._124_4_ = 1;
    }
    else {
      QSignalSpy::QSignalSpy
                ((QSignalSpy *)&sourceRowsInsertedSpy.m_waiting,(QObject *)parent,
                 "2rowsAboutToBeInserted(QModelIndex, int, int)");
      bVar1 = QSignalSpy::isValid((QSignalSpy *)&sourceRowsInsertedSpy.m_waiting);
      bVar2 = QTest::qVerify(bVar1,"sourceRowsAboutToBeInsertedSpy.isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0xa5);
      if ((bVar2 & 1) == 0) {
        proxyRowsInsertedSpy._124_4_ = 1;
      }
      else {
        QSignalSpy::QSignalSpy
                  ((QSignalSpy *)local_278,(QObject *)parent,"2rowsInserted(QModelIndex, int, int)")
        ;
        bVar1 = QSignalSpy::isValid((QSignalSpy *)local_278);
        bVar2 = QTest::qVerify(bVar1,"sourceRowsInsertedSpy.isValid()","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0xa7);
        if ((bVar2 & 1) == 0) {
          proxyRowsInsertedSpy._124_4_ = 1;
        }
        else {
          QModelIndex::QModelIndex(&local_2b0);
          (**(code **)(*(long *)parent + 0x60))(local_298,parent,1,0,&local_2b0);
          iVar3 = (**(code **)(*(long *)parent + 0x78))(parent,local_298);
          local_27c = iVar3;
          QModelIndex::QModelIndex(&local_2c8);
          iVar4 = RootIndexProxyModel::rowCount((QModelIndex *)local_30);
          bVar2 = QTest::qCompare(iVar3,iVar4,"oldRowCount","proxyModel.rowCount()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                  ,0xa9);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            QModelIndex::QModelIndex(&local_2e0);
            RootIndexProxyModel::insertRows((int)local_30,1,(QModelIndex *)0x1);
            iVar3 = local_27c + 1;
            QModelIndex::QModelIndex(&local_2f8);
            iVar4 = RootIndexProxyModel::rowCount((QModelIndex *)local_30);
            bVar2 = QTest::qCompare(iVar3,iVar4,"oldRowCount + 1","proxyModel.rowCount()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                    ,0xab);
            if (((bVar2 ^ 0xff) & 1) == 0) {
              iVar3 = local_27c + 1;
              QModelIndex::QModelIndex(&local_328);
              (**(code **)(*(long *)parent + 0x60))(local_310,parent,1,0,&local_328);
              iVar4 = (**(code **)(*(long *)parent + 0x78))(parent,local_310);
              bVar2 = QTest::qCompare(iVar3,iVar4,"oldRowCount + 1",
                                      "baseModel->rowCount(baseModel->index(1, 0))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                      ,0xac);
              if (((bVar2 ^ 0xff) & 1) == 0) {
                local_330 = QList<QList<QVariant>_>::count
                                      ((QList<QList<QVariant>_> *)
                                       &proxyRowsAboutToBeInsertedSpy.field_0x8);
                arguments.d.size._4_4_ = 1;
                bVar1 = QTest::qCompare<long_long,int>
                                  (&local_330,(qint32 *)((long)&arguments.d.size + 4),
                                   "proxyRowsAboutToBeInsertedSpy.count()","1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                   ,0xad);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  QList<QList<QVariant>_>::takeFirst
                            ((value_type *)local_350,
                             (QList<QList<QVariant>_> *)&proxyRowsAboutToBeInsertedSpy.field_0x8);
                  pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,0);
                  QVariant::value<QModelIndex>(&local_368,pQVar5);
                  QModelIndex::QModelIndex(&local_380);
                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                    (&local_368,&local_380,"arguments.at(0).value<QModelIndex>()",
                                     "QModelIndex()",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0xaf);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,1);
                    iVar3 = QVariant::value<int>(pQVar5);
                    bVar2 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                            ,0xb0);
                    if ((bVar2 & 1) == 0) {
                      proxyRowsInsertedSpy._124_4_ = 1;
                    }
                    else {
                      pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,2);
                      iVar3 = QVariant::value<int>(pQVar5);
                      bVar2 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                              ,0xb1);
                      if ((bVar2 & 1) == 0) {
                        proxyRowsInsertedSpy._124_4_ = 1;
                      }
                      else {
                        local_388 = QList<QList<QVariant>_>::count
                                              ((QList<QList<QVariant>_> *)
                                               &proxyRowsInsertedSpy.field_0x8);
                        local_38c = 1;
                        bVar1 = QTest::qCompare<long_long,int>
                                          (&local_388,&local_38c,"proxyRowsInsertedSpy.count()","1",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                           ,0xb2);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          QList<QList<QVariant>_>::takeFirst
                                    (&local_3a8,
                                     (QList<QList<QVariant>_> *)&proxyRowsInsertedSpy.field_0x8);
                          QList<QVariant>::operator=((QList<QVariant> *)local_350,&local_3a8);
                          QList<QVariant>::~QList(&local_3a8);
                          pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,0);
                          QVariant::value<QModelIndex>(&local_3c0,pQVar5);
                          QModelIndex::QModelIndex(&local_3d8);
                          bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                            (&local_3c0,&local_3d8,
                                             "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0xb4);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,1);
                            iVar3 = QVariant::value<int>(pQVar5);
                            bVar2 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb5);
                            if ((bVar2 & 1) == 0) {
                              proxyRowsInsertedSpy._124_4_ = 1;
                            }
                            else {
                              pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,2);
                              iVar3 = QVariant::value<int>(pQVar5);
                              bVar2 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb6);
                              if ((bVar2 & 1) == 0) {
                                proxyRowsInsertedSpy._124_4_ = 1;
                              }
                              else {
                                local_3e0 = QList<QList<QVariant>_>::count
                                                      ((QList<QList<QVariant>_> *)
                                                       &sourceRowsAboutToBeInsertedSpy.field_0x8);
                                local_3e4 = 1;
                                bVar1 = QTest::qCompare<long_long,int>
                                                  (&local_3e0,&local_3e4,
                                                   "sourceRowsAboutToBeInsertedSpy.count()","1",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb7);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  QList<QList<QVariant>_>::takeFirst
                                            (&local_400,
                                             (QList<QList<QVariant>_> *)
                                             &sourceRowsAboutToBeInsertedSpy.field_0x8);
                                  QList<QVariant>::operator=
                                            ((QList<QVariant> *)local_350,&local_400);
                                  QList<QVariant>::~QList(&local_400);
                                  pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,0);
                                  QVariant::value<QModelIndex>(&local_418,pQVar5);
                                  QModelIndex::QModelIndex(&local_448);
                                  (**(code **)(*(long *)parent + 0x60))
                                            (&local_430,parent,1,0,&local_448);
                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                    (&local_418,&local_430,
                                                     "arguments.at(0).value<QModelIndex>()",
                                                     "baseModel->index(1, 0)",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb9);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,1);
                                    iVar3 = QVariant::value<int>(pQVar5);
                                    bVar2 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()",
                                                            "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xba);
                                    if ((bVar2 & 1) == 0) {
                                      proxyRowsInsertedSpy._124_4_ = 1;
                                    }
                                    else {
                                      pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,2);
                                      iVar3 = QVariant::value<int>(pQVar5);
                                      bVar2 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()"
                                                              ,"1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbb);
                                      if ((bVar2 & 1) == 0) {
                                        proxyRowsInsertedSpy._124_4_ = 1;
                                      }
                                      else {
                                        local_450 = QList<QList<QVariant>_>::count
                                                              ((QList<QList<QVariant>_> *)
                                                               &sourceRowsInsertedSpy.field_0x8);
                                        local_454 = 1;
                                        bVar1 = QTest::qCompare<long_long,int>
                                                          (&local_450,&local_454,
                                                           "sourceRowsInsertedSpy.count()","1",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbc);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          QList<QList<QVariant>_>::takeFirst
                                                    (&local_470,
                                                     (QList<QList<QVariant>_> *)
                                                     &sourceRowsInsertedSpy.field_0x8);
                                          QList<QVariant>::operator=
                                                    ((QList<QVariant> *)local_350,&local_470);
                                          QList<QVariant>::~QList(&local_470);
                                          pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,
                                                                       0);
                                          QVariant::value<QModelIndex>(&local_488,pQVar5);
                                          QModelIndex::QModelIndex(&local_4b8);
                                          (**(code **)(*(long *)parent + 0x60))
                                                    (&local_4a0,parent,1,0,&local_4b8);
                                          bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                            (&local_488,&local_4a0,
                                                             "arguments.at(0).value<QModelIndex>()",
                                                             "baseModel->index(1, 0)",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbe);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            pQVar5 = QList<QVariant>::at((QList<QVariant> *)
                                                                         local_350,1);
                                            iVar3 = QVariant::value<int>(pQVar5);
                                            bVar2 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(1).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbf);
                                            if ((bVar2 & 1) == 0) {
                                              proxyRowsInsertedSpy._124_4_ = 1;
                                            }
                                            else {
                                              pQVar5 = QList<QVariant>::at((QList<QVariant> *)
                                                                           local_350,2);
                                              iVar3 = QVariant::value<int>(pQVar5);
                                              bVar2 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(2).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xc0);
                                              if ((bVar2 & 1) == 0) {
                                                proxyRowsInsertedSpy._124_4_ = 1;
                                              }
                                              else {
                                                QObject::deleteLater();
                                                proxyRowsInsertedSpy._124_4_ = 0;
                                              }
                                            }
                                          }
                                          else {
                                            proxyRowsInsertedSpy._124_4_ = 1;
                                          }
                                        }
                                        else {
                                          proxyRowsInsertedSpy._124_4_ = 1;
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    proxyRowsInsertedSpy._124_4_ = 1;
                                  }
                                }
                                else {
                                  proxyRowsInsertedSpy._124_4_ = 1;
                                }
                              }
                            }
                          }
                          else {
                            proxyRowsInsertedSpy._124_4_ = 1;
                          }
                        }
                        else {
                          proxyRowsInsertedSpy._124_4_ = 1;
                        }
                      }
                    }
                  }
                  else {
                    proxyRowsInsertedSpy._124_4_ = 1;
                  }
                  QList<QVariant>::~QList((QList<QVariant> *)local_350);
                }
                else {
                  proxyRowsInsertedSpy._124_4_ = 1;
                }
              }
              else {
                proxyRowsInsertedSpy._124_4_ = 1;
              }
            }
            else {
              proxyRowsInsertedSpy._124_4_ = 1;
            }
          }
          else {
            proxyRowsInsertedSpy._124_4_ = 1;
          }
        }
        QSignalSpy::~QSignalSpy((QSignalSpy *)local_278);
      }
      QSignalSpy::~QSignalSpy((QSignalSpy *)&sourceRowsInsertedSpy.m_waiting);
    }
    QSignalSpy::~QSignalSpy((QSignalSpy *)&sourceRowsAboutToBeInsertedSpy.m_waiting);
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_f0);
  RootIndexProxyModel::~RootIndexProxyModel(local_30);
  return;
}

Assistant:

void tst_RootIndexProxyModel::insertRow()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = createTreeModel(this);
    RootIndexProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setRootIndex(baseModel->index(1, 0));
    QSignalSpy proxyRowsAboutToBeInsertedSpy(&proxyModel, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxyRowsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxyRowsInsertedSpy(&proxyModel, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxyRowsInsertedSpy.isValid());
    QSignalSpy sourceRowsAboutToBeInsertedSpy(baseModel, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(sourceRowsAboutToBeInsertedSpy.isValid());
    QSignalSpy sourceRowsInsertedSpy(baseModel, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(sourceRowsInsertedSpy.isValid());
    int oldRowCount = baseModel->rowCount(baseModel->index(1, 0));
    QCOMPARE(oldRowCount, proxyModel.rowCount());
    proxyModel.insertRows(1, 1);
    QCOMPARE(oldRowCount + 1, proxyModel.rowCount());
    QCOMPARE(oldRowCount + 1, baseModel->rowCount(baseModel->index(1, 0)));
    QCOMPARE(proxyRowsAboutToBeInsertedSpy.count(), 1);
    QList<QVariant> arguments = proxyRowsAboutToBeInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(proxyRowsInsertedSpy.count(), 1);
    arguments = proxyRowsInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsAboutToBeInsertedSpy.count(), 1);
    arguments = sourceRowsAboutToBeInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsInsertedSpy.count(), 1);
    arguments = sourceRowsInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}